

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void DumpCoverageList(range_list list)

{
  undefined8 *in_RDI;
  
  if ((in_RDI != (undefined8 *)0x0) && (printf("%zd - %zd",*in_RDI,in_RDI[1]), in_RDI[2] != 0)) {
    printf(", ");
    DumpCoverageList((range_list)0x1272b1);
  }
  return;
}

Assistant:

static void DumpCoverageList(range_list list)
{
    if (!list)
        return;
    printf("%zd - %zd", list->start, list->end);
    if (list->next != NULL)
    {
        printf(", ");
        DumpCoverageList(list->next);
    }
}